

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_binary_text_gen.cpp
# Opt level: O2

void flatbuffers::anon_unknown_7::GenerateRegion
               (ostream *os,BinaryRegion *region,BinarySection *section,uint8_t *binary,
               OutputConfig *output_config)

{
  BinaryRegionStatus BVar1;
  ostream *poVar2;
  undefined8 uVar3;
  ulong uVar4;
  uint8_t i;
  uint64_t j;
  ulong uVar5;
  string *psVar6;
  ulong uVar7;
  string value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_248;
  size_type local_240;
  BinaryRegion *local_238;
  DocContinuation doc_continuation;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_1d8;
  stringstream ss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  long lStack_198;
  uint auStack_190 [88];
  
  doc_continuation.value_start_column = 0;
  doc_continuation.value._M_dataplus._M_p = (pointer)&doc_continuation.value.field_2;
  doc_continuation.value._M_string_length = 0;
  doc_continuation.value.field_2._M_local_buf[0] = '\0';
  local_248 = &(region->comment).name;
  local_240 = 0;
  uVar7 = 0;
  local_238 = (BinaryRegion *)section;
  do {
    do {
      do {
        if (region->length <= uVar7) {
          std::__cxx11::string::~string((string *)&doc_continuation.value);
          return;
        }
        if (uVar7 % *(ulong *)(binary + 0x10) == 0) {
          std::endl<char,std::char_traits<char>>(os);
          poVar2 = std::operator<<(os,"  +0x");
          ToHex<unsigned_long>((string *)&ss,region->offset + uVar7,*(size_t *)(binary + 0x18));
          std::operator<<(poVar2,(string *)&ss);
          std::__cxx11::string::~string((string *)&ss);
          poVar2 = std::operator<<(os," ");
          std::operator<<(poVar2,binary[0x20]);
        }
        poVar2 = std::operator<<(os," ");
        ToHex_abi_cxx11_((string *)&ss,
                         (flatbuffers *)
                         (ulong)*(byte *)((long)&(((string *)&local_238->offset)->_M_dataplus)._M_p
                                         + uVar7 + region->offset),i);
        std::operator<<(poVar2,(string *)&ss);
        std::__cxx11::string::~string((string *)&ss);
        uVar7 = uVar7 + 1;
        uVar4 = *(ulong *)(binary + 0x10);
      } while ((uVar7 % uVar4 != 0) && (uVar7 != region->length));
      uVar5 = uVar7;
      if (uVar7 == region->length) {
        for (; uVar5 % uVar4 != 0; uVar5 = uVar5 + 1) {
          std::operator<<(os,"   ");
          uVar4 = *(ulong *)(binary + 0x10);
        }
      }
      poVar2 = std::operator<<(os," ");
      poVar2 = std::operator<<(poVar2,binary[0x20]);
      uVar4 = local_240 & 1;
      local_240 = CONCAT71((int7)((ulong)poVar2 >> 8),1);
    } while (uVar4 != 0);
    std::operator<<(os," ");
    if (doc_continuation.value_start_column != 0) {
      _ss = (pointer)&local_1a8;
      std::__cxx11::string::_M_construct((ulong)&ss,(char)doc_continuation.value_start_column + -2);
      std::operator<<(os,(string *)&ss);
      std::__cxx11::string::~string((string *)&ss);
      poVar2 = std::operator<<(os,binary[0x20]);
      std::operator<<(poVar2," ");
      std::__cxx11::string::substr((ulong)&ss,(ulong)&doc_continuation.value);
      std::operator<<(os,(string *)&ss);
      std::__cxx11::string::~string((string *)&ss);
      std::__cxx11::string::substr((ulong)&ss,(ulong)&doc_continuation.value);
      std::__cxx11::string::operator=((string *)&doc_continuation.value,(string *)&ss);
      psVar6 = (string *)&ss;
      goto LAB_002386f1;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    *(long *)((long)&lStack_198 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) =
         (long)*(int *)binary;
    *(uint *)((long)auStack_190 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) &
         0xffffff4f | 0x20;
    (anonymous_namespace)::GenerateTypeString_abi_cxx11_
              (&value,(_anonymous_namespace_ *)region,(BinaryRegion *)0xffffff4f);
    std::operator<<((ostream *)local_1a8._M_local_buf,(string *)&value);
    std::__cxx11::string::~string((string *)&value);
    std::__cxx11::stringbuf::str();
    std::operator<<(os,(string *)&value);
    std::__cxx11::string::~string((string *)&value);
    std::__cxx11::stringbuf::str();
    local_240 = value._M_string_length;
    std::__cxx11::string::~string((string *)&value);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    poVar2 = std::operator<<(os," ");
    poVar2 = std::operator<<(poVar2,binary[0x20]);
    std::operator<<(poVar2," ");
    if (region->array_length == 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      *(long *)((long)&lStack_198 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) =
           (long)*(int *)(binary + 8);
      *(uint *)((long)auStack_190 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) &
           0xffffff4f | 0x20;
      (anonymous_namespace)::ToValueString_abi_cxx11_
                (&value,(_anonymous_namespace_ *)region,local_238,binary,output_config);
      std::operator<<((ostream *)local_1a8._M_local_buf,(string *)&value);
      std::__cxx11::string::~string((string *)&value);
      std::__cxx11::stringbuf::str();
      std::operator<<(os,(string *)&value);
      std::__cxx11::string::~string((string *)&value);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    }
    else {
      doc_continuation.value_start_column = local_240 + 3;
      (anonymous_namespace)::ToValueString_abi_cxx11_
                (&value,(_anonymous_namespace_ *)region,local_238,binary,output_config);
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      *(long *)((long)&lStack_198 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) =
           (long)*(int *)(binary + 8);
      *(uint *)((long)auStack_190 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) &
           0xffffff4f | 0x20;
      std::__cxx11::string::substr((ulong)&local_268,(ulong)&value);
      std::operator<<((ostream *)local_1a8._M_local_buf,(string *)&local_268);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::stringbuf::str();
      std::operator<<(os,(string *)&local_268);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::substr((ulong)&local_268,(ulong)&value);
      std::__cxx11::string::operator=((string *)&doc_continuation.value,(string *)&local_268);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::__cxx11::string::~string((string *)&value);
    }
    poVar2 = std::operator<<(os," ");
    poVar2 = std::operator<<(poVar2,binary[0x20]);
    std::operator<<(poVar2," ");
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    local_288._M_string_length = 0;
    local_288.field_2._M_local_buf[0] = '\0';
    switch((region->comment).type) {
    case Unknown:
      break;
    case SizePrefix:
      break;
    case RootTableOffset:
      std::operator+(&value,"offset to root table `",local_248);
      std::operator+((string *)&ss,&value,"`");
      goto LAB_0023830d;
    case FileIdentifier:
      break;
    case Padding:
      break;
    case VTableSize:
      break;
    case VTableRefferingTableLength:
      break;
    case VTableFieldOffset:
      std::operator+((string *)&ss,"offset to field `",local_248);
      goto LAB_0023835d;
    case VTableUnknownFieldOffset:
      std::__cxx11::to_string(&local_268,(region->comment).index);
      std::operator+(&value,"offset to unknown field (id: ",&local_268);
      std::operator+((string *)&ss,&value,")");
      goto LAB_00238427;
    case TableVTableOffset:
      break;
    case TableField:
      std::operator+((string *)&ss,"table field `",local_248);
LAB_0023835d:
      std::__cxx11::string::operator=((string *)&local_288,(string *)&ss);
      psVar6 = (string *)&ss;
      goto LAB_00238449;
    case TableUnknownField:
      break;
    case TableOffsetField:
      std::operator+(&value,"offset to field `",local_248);
      std::operator+((string *)&ss,&value,"`");
      goto LAB_0023830d;
    case StructField:
      std::operator+(&value,"struct field `",local_248);
      std::operator+((string *)&ss,&value,"`");
LAB_0023830d:
      std::__cxx11::string::operator=((string *)&local_288,(string *)&ss);
      std::__cxx11::string::~string((string *)&ss);
      psVar6 = &value;
      goto LAB_00238449;
    case ArrayField:
      std::operator+(&local_1f8,"array field `",local_248);
      std::operator+(&local_268,&local_1f8,"`[");
      std::__cxx11::to_string(&local_1d8,(region->comment).index);
      std::operator+(&value,&local_268,&local_1d8);
      std::operator+((string *)&ss,&value,"]");
      std::__cxx11::string::operator=((string *)&local_288,(string *)&ss);
      std::__cxx11::string::~string((string *)&ss);
      std::__cxx11::string::~string((string *)&value);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_268);
      psVar6 = &local_1f8;
      goto LAB_00238449;
    case StringLength:
      break;
    case StringValue:
      break;
    case StringTerminator:
      break;
    case VectorLength:
      break;
    case VectorValue:
      std::__cxx11::to_string(&local_268,(region->comment).index);
      std::operator+(&value,"value[",&local_268);
      std::operator+((string *)&ss,&value,"]");
      goto LAB_00238427;
    case VectorTableValue:
      std::__cxx11::to_string(&local_268,(region->comment).index);
      std::operator+(&value,"offset to table[",&local_268);
      std::operator+((string *)&ss,&value,"]");
      goto LAB_00238427;
    case VectorStringValue:
      std::__cxx11::to_string(&local_268,(region->comment).index);
      std::operator+(&value,"offset to string[",&local_268);
      std::operator+((string *)&ss,&value,"]");
      goto LAB_00238427;
    case VectorUnionValue:
      std::__cxx11::to_string(&local_268,(region->comment).index);
      std::operator+(&value,"offset to union[",&local_268);
      std::operator+((string *)&ss,&value,"]");
LAB_00238427:
      std::__cxx11::string::operator=((string *)&local_288,(string *)&ss);
      std::__cxx11::string::~string((string *)&ss);
      std::__cxx11::string::~string((string *)&value);
      psVar6 = &local_268;
LAB_00238449:
      std::__cxx11::string::~string((string *)psVar6);
    default:
      goto switchD_002380d1_default;
    }
    std::__cxx11::string::assign((char *)&local_288);
switchD_002380d1_default:
    if ((region->comment).default_value._M_string_length != 0) {
      std::operator+((string *)&ss," ",&(region->comment).default_value);
      std::__cxx11::string::append((string *)&local_288);
      std::__cxx11::string::~string((string *)&ss);
    }
    BVar1 = (region->comment).status;
    switch(BVar1) {
    case ERROR:
      std::operator+((string *)&ss,"ERROR: ",&local_288);
LAB_002384f8:
      std::__cxx11::string::operator=((string *)&local_288,(string *)&ss);
      psVar6 = (string *)&ss;
      goto LAB_002386d9;
    case ERROR_OFFSET_OUT_OF_BINARY:
      std::operator+(&value,"ERROR: ",&local_288);
      std::operator+((string *)&ss,&value,". Invalid offset, points outside the binary.");
      break;
    case ERROR_INCOMPLETE_BINARY:
      std::operator+(&local_1f8,"ERROR: ",&local_288);
      std::operator+(&local_268,&local_1f8,". Incomplete binary, expected to read ");
      std::operator+(&value,&local_268,&(region->comment).status_message);
      std::operator+((string *)&ss,&value," bytes.");
      std::__cxx11::string::operator=((string *)&local_288,(string *)&ss);
      std::__cxx11::string::~string((string *)&ss);
      std::__cxx11::string::~string((string *)&value);
      std::__cxx11::string::~string((string *)&local_268);
      psVar6 = &local_1f8;
      goto LAB_002386d9;
    case ERROR_LENGTH_TOO_LONG:
      std::operator+(&value,"ERROR: ",&local_288);
      std::operator+((string *)&ss,&value,". Longer than the binary.");
      break;
    case ERROR_LENGTH_TOO_SHORT:
      std::operator+(&value,"ERROR: ",&local_288);
      std::operator+((string *)&ss,&value,". Shorter than the minimum length: ");
      break;
    case ERROR_REQUIRED_FIELD_NOT_PRESENT:
      std::operator+(&value,"ERROR: ",&local_288);
      std::operator+((string *)&ss,&value,". Required field is not present.");
      break;
    case ERROR_INVALID_UNION_TYPE:
      std::operator+(&value,"ERROR: ",&local_288);
      std::operator+((string *)&ss,&value,". Invalid union type value.");
      break;
    case ERROR_CYCLE_DETECTED:
      std::operator+(&value,"ERROR: ",&local_288);
      std::operator+((string *)&ss,&value,". Invalid offset, cycle detected.");
      break;
    default:
      switch(BVar1) {
      case WARN:
        std::operator+((string *)&ss,"WARN: ",&local_288);
        goto LAB_002384f8;
      case WARN_NO_REFERENCES:
        break;
      case WARN_CORRUPTED_PADDING:
        break;
      case WARN_PADDING_LENGTH:
        break;
      default:
        goto switchD_002384df_default;
      }
      std::__cxx11::string::assign((char *)&local_288);
      goto switchD_002384df_default;
    }
    std::__cxx11::string::operator=((string *)&local_288,(string *)&ss);
    std::__cxx11::string::~string((string *)&ss);
    psVar6 = &value;
LAB_002386d9:
    std::__cxx11::string::~string((string *)psVar6);
switchD_002384df_default:
    psVar6 = &local_288;
    std::operator<<(os,(string *)psVar6);
LAB_002386f1:
    uVar3 = std::__cxx11::string::~string((string *)psVar6);
    local_240 = CONCAT71((int7)((ulong)uVar3 >> 8),doc_continuation.value._M_string_length == 0);
  } while( true );
}

Assistant:

static void GenerateRegion(std::ostream &os, const BinaryRegion &region,
                           const BinarySection &section, const uint8_t *binary,
                           const OutputConfig &output_config) {
  bool doc_generated = false;
  DocContinuation doc_continuation;
  for (uint64_t i = 0; i < region.length; ++i) {
    if ((i % output_config.max_bytes_per_line) == 0) {
      // Start a new line of output
      os << std::endl;
      os << "  +0x" << ToHex(region.offset + i, output_config.offset_max_char);
      os << " " << output_config.delimiter;
    }

    // Add each byte
    os << " " << ToHex(binary[region.offset + i]);

    // Check for end of line or end of region conditions.
    if (((i + 1) % output_config.max_bytes_per_line == 0) ||
        i + 1 == region.length) {
      if (i + 1 == region.length) {
        // We are out of bytes but haven't the kMaxBytesPerLine, so we need to
        // zero those out to align everything globally.
        for (uint64_t j = i + 1; (j % output_config.max_bytes_per_line) != 0;
             ++j) {
          os << "   ";
        }
      }
      os << " " << output_config.delimiter;
      // This is the end of the first line or its the last byte of the region,
      // generate the end-of-line documentation.
      if (!doc_generated) {
        os << " ";
        GenerateDocumentation(os, region, section, binary, doc_continuation,
                              output_config);

        // If we have a value in the doc continuation, that means the doc is
        // being printed on multiple lines.
        doc_generated = doc_continuation.value.empty();
      }
    }
  }
}